

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactions.cc
# Opt level: O1

void INTERACTIONS::sort_and_filter_duplicate_interactions
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *vec,bool filter_duplicates,size_t *removed_cnt,size_t *sorted_cnt)

{
  undefined1 *puVar1;
  size_t sVar2;
  pointer pcVar3;
  pointer ppVar4;
  pointer ppVar5;
  undefined1 *puVar6;
  int iVar7;
  pointer pbVar8;
  char *pcVar9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ppVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ppVar14;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ppVar15;
  bool bVar16;
  undefined7 in_register_00000031;
  bool bVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *ppVar19;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  *i;
  long lVar20;
  iterator __first;
  pair<char_*,_long> pVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  res;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  vec_sorted;
  string sorted_i;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_b8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_88;
  undefined4 local_64;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  size_t *local_40;
  size_t *local_38;
  
  local_64 = (undefined4)CONCAT71(in_register_00000031,filter_duplicates);
  *removed_cnt = 0;
  *sorted_cnt = 0;
  local_88.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        *)0x0;
  local_88.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
        *)0x0;
  pbVar8 = (vec->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_40 = removed_cnt;
  local_38 = sorted_cnt;
  if ((vec->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar8) {
    lVar20 = 8;
    uVar13 = 0;
    do {
      local_60 = local_50;
      lVar11 = *(long *)((long)pbVar8 + lVar20 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,lVar11,
                 *(long *)((long)&(pbVar8->_M_dataplus)._M_p + lVar20) + lVar11);
      puVar6 = local_60;
      if (local_58 != 0) {
        puVar1 = local_60 + local_58;
        pVar21 = std::get_temporary_buffer<char>((local_58 - (local_58 + 1 >> 0x3f)) + 1 >> 1);
        pcVar9 = pVar21.first;
        if (pcVar9 == (char *)0x0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar6,puVar1);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar6,puVar1,pcVar9,pVar21.second);
        }
        operator_delete(pcVar9);
      }
      paVar18 = &local_b8.first.field_2;
      local_b8.first._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b8,local_60,local_60 + local_58);
      local_b8.second = uVar13;
      std::
      vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
      ::emplace_back<std::pair<std::__cxx11::string,unsigned_long>>
                ((vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>
                  *)&local_88,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8.first._M_dataplus._M_p != paVar18) {
        operator_delete(local_b8.first._M_dataplus._M_p);
      }
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      uVar13 = uVar13 + 1;
      pbVar8 = (vec->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar20 + 0x20;
    } while (uVar13 < (ulong)((long)(vec->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar8 >> 5)
            );
  }
  ppVar5 = local_88.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = local_88.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((char)local_64 != '\0') {
    if (local_88.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_88.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar20 = ((long)local_88.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_88.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                           *)&local_b8,
                          (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                           )local_88.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (lVar20 - (lVar20 + 1 >> 0x3f)) + 1 >> 1);
      if (local_b8.first.field_2._M_allocated_capacity == 0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::__0>>
                  (ppVar4,ppVar5);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,std::pair<std::__cxx11::string,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::__0>>
                  (ppVar4,ppVar5,local_b8.first.field_2._M_allocated_capacity,
                   local_b8.first._M_string_length);
      }
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                  *)&local_b8);
    }
    __first._M_current =
         local_88.
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    ppVar19 = local_88.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 1;
    ppVar14 = __first._M_current;
    ppVar15 = local_88.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_88.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start + 1 !=
        local_88.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish &&
        local_88.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_88.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        ppVar10 = ppVar19;
        sVar2 = ppVar10[-1].first._M_string_length;
        if (sVar2 == (ppVar10->first)._M_string_length) {
          if (sVar2 == 0) {
            ppVar14 = ppVar10 + -1;
            break;
          }
          iVar7 = bcmp(ppVar10[-1].first._M_dataplus._M_p,(ppVar10->first)._M_dataplus._M_p,sVar2);
          ppVar14 = ppVar15;
          if (iVar7 == 0) break;
        }
        ppVar19 = ppVar10 + 1;
        ppVar14 = __first._M_current;
        ppVar15 = ppVar10;
      } while (ppVar10 + 1 != __first._M_current);
    }
    if (ppVar14 != __first._M_current) {
      ppVar19 = ppVar14 + 2;
      for (; ppVar19 != __first._M_current; ppVar19 = ppVar19 + 1) {
        sVar2 = (ppVar14->first)._M_string_length;
        if ((sVar2 != (ppVar19->first)._M_string_length) ||
           ((ppVar15 = ppVar14, sVar2 != 0 &&
            (iVar7 = bcmp((ppVar14->first)._M_dataplus._M_p,(ppVar19->first)._M_dataplus._M_p,sVar2)
            , iVar7 != 0)))) {
          ppVar15 = ppVar14 + 1;
          std::__cxx11::string::operator=((string *)ppVar15,(string *)ppVar19);
          ppVar14[1].second = ppVar19->second;
        }
        ppVar14 = ppVar15;
      }
      __first._M_current = ppVar14 + 1;
    }
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::_M_erase(&local_88,__first,
               (iterator)
               local_88.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    ppVar5 = local_88.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = local_88.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar20 = (long)local_88.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_88.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3;
    lVar11 = lVar20 * -0x3333333333333333;
    *local_40 = ((long)(vec->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(vec->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5) +
                lVar20 * 0x3333333333333333;
    if (local_88.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_88.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                           *)&local_b8,
                          (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
                           )local_88.
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                          (lVar11 - (lVar11 + 1 >> 0x3f)) + 1 >> 1);
      if (local_b8.first.field_2._M_allocated_capacity == 0) {
        std::
        __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::__2>>
                  (ppVar4);
      }
      else {
        std::
        __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string,unsigned_long>*,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>>,std::pair<std::__cxx11::string,unsigned_long>*,long,__gnu_cxx::__ops::_Iter_comp_iter<INTERACTIONS::sort_and_filter_duplicate_interactions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,bool,unsigned_long&,unsigned_long&)::__2>>
                  (ppVar4,ppVar5,local_b8.first.field_2._M_allocated_capacity,
                   local_b8.first._M_string_length);
      }
      std::
      _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
      ::~_Temporary_buffer
                ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                  *)&local_b8);
    }
  }
  ppVar4 = local_88.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_b8.first._M_dataplus._M_p = (pointer)0x0;
  local_b8.first._M_string_length = 0;
  local_b8.first.field_2._M_allocated_capacity = 0;
  ppVar19 = local_88.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppVar19 == ppVar4) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(vec,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_b8);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::~vector(&local_88);
      return;
    }
    uVar13 = (ppVar19->first)._M_string_length;
    if (uVar13 < 2) {
LAB_001f9017:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b8,&ppVar19->first);
      *local_38 = *local_38 + 1;
    }
    else {
      pcVar3 = (ppVar19->first)._M_dataplus._M_p;
      if (pcVar3 != pcVar3 + (uVar13 - 1)) {
        uVar12 = 1;
        bVar16 = false;
        bVar17 = false;
        do {
          if (pcVar3[uVar12 - 1] == pcVar3[uVar12]) {
            bVar16 = true;
            if (bVar17) goto LAB_001f9017;
          }
          else {
            bVar17 = true;
            if (bVar16) goto LAB_001f9017;
          }
          uVar12 = uVar12 + 1;
        } while (uVar13 != uVar12);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_b8,
                  (vec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + ppVar19->second);
    }
    ppVar19 = ppVar19 + 1;
  } while( true );
}

Assistant:

void sort_and_filter_duplicate_interactions(
    std::vector<std::string>& vec, bool filter_duplicates, size_t& removed_cnt, size_t& sorted_cnt)
{
  // 2 out parameters
  removed_cnt = 0;
  sorted_cnt = 0;

  // interaction value sort + original position
  std::vector<std::pair<std::string, size_t>> vec_sorted;
  for (size_t i = 0; i < vec.size(); ++i)
  {
    std::string sorted_i(vec[i]);
    std::stable_sort(std::begin(sorted_i), std::end(sorted_i));
    vec_sorted.push_back(make_pair(sorted_i, i));
  }

  if (filter_duplicates)
  {
    // remove duplicates
    std::stable_sort(vec_sorted.begin(), vec_sorted.end(),
        [](std::pair<std::string, size_t> const& a, std::pair<std::string, size_t> const& b) {
          return a.first < b.first;
        });
    auto last = unique(vec_sorted.begin(), vec_sorted.end(),
        [](std::pair<std::string, size_t> const& a, std::pair<std::string, size_t> const& b) {
          return a.first == b.first;
        });
    vec_sorted.erase(last, vec_sorted.end());

    // report number of removed interactions
    removed_cnt = vec.size() - vec_sorted.size();

    // restore original order
    std::stable_sort(vec_sorted.begin(), vec_sorted.end(),
        [](std::pair<std::string, size_t> const& a, std::pair<std::string, size_t> const& b) {
          return a.second < b.second;
        });
  }

  // we have original vector and vector with duplicates removed + corresponding indexes in original vector
  // plus second vector's data is sorted. We can reuse it if we need interaction to be left sorted.
  // let's make a new vector from these two sources - without dulicates and with sorted data whenever it's needed.
  std::vector<std::string> res;
  for (auto& i : vec_sorted)
  {
    if (must_be_left_sorted(i.first))
    {
      // if so - copy sorted data to result
      res.push_back(i.first);
      ++sorted_cnt;
    }
    else  // else - move unsorted data to result
      res.push_back(vec[i.second]);
  }

  vec = res;
}